

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O1

void __thiscall (anonymous_namespace)::LineEdit::~LineEdit(LineEdit *this)

{
  int *piVar1;
  
  *(undefined ***)(this + -0x10) = &PTR_metaObject_00167fb8;
  *(undefined ***)this = &PTR__LineEdit_00168170;
  piVar1 = *(int **)(this + 0x18);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x18),2,0x10);
    }
  }
  QLineEdit::~QLineEdit((QLineEdit *)(this + -0x10));
  operator_delete((QLineEdit *)(this + -0x10),0x40);
  return;
}

Assistant:

Q_OBJECT
public:
    LineEdit(QWidget* parent = nullptr)
        : QLineEdit(parent)
    {
        setContextMenuPolicy(Qt::NoContextMenu);
        connect(this, &LineEdit::returnPressed, this, &LineEdit::handleReturnPressed);
    }